

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

int envy_bios_parse_mem_train_ptrn(envy_bios *bios)

{
  uint8_t *res;
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  envy_bios_mem_train_ptrn_entry *peVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  uint8_t *res_00;
  
  uVar2 = (bios->mem).train_ptrn.offset;
  if (uVar2 != 0) {
    iVar3 = bios_u8(bios,(uint)uVar2,&(bios->mem).train_ptrn.version);
    iVar4 = bios_u8(bios,(bios->mem).train_ptrn.offset + 1,&(bios->mem).train_ptrn.hlen);
    iVar5 = bios_u8(bios,(bios->mem).train_ptrn.offset + 2,&(bios->mem).train_ptrn.rlen);
    iVar6 = bios_u8(bios,(bios->mem).train_ptrn.offset + 3,&(bios->mem).train_ptrn.subentrylen);
    res = &(bios->mem).train_ptrn.entriesnum;
    iVar7 = bios_u8(bios,(bios->mem).train_ptrn.offset + 4,res);
    (bios->mem).train_ptrn.subentries = '\x01';
    if (iVar7 == 0 && ((iVar6 == 0 && iVar5 == 0) && (iVar4 == 0 && iVar3 == 0))) {
      envy_bios_block(bios,(uint)(bios->mem).train_ptrn.offset,
                      (uint)(bios->mem).train_ptrn.entriesnum * (uint)(bios->mem).train_ptrn.rlen +
                      (uint)(bios->mem).train_ptrn.hlen,"MEM TRAIN PATTERN",-1);
      bVar10 = (bios->mem).train_ptrn.entriesnum;
      peVar9 = (envy_bios_mem_train_ptrn_entry *)calloc((ulong)bVar10,6);
      (bios->mem).train_ptrn.entries = peVar9;
      if (peVar9 == (envy_bios_mem_train_ptrn_entry *)0x0) {
        iVar3 = -0xc;
      }
      else {
        lVar11 = 2;
        for (uVar12 = 0; uVar12 < bVar10; uVar12 = uVar12 + 1) {
          peVar9 = (bios->mem).train_ptrn.entries;
          uVar8 = (int)uVar12 *
                  ((uint)(bios->mem).train_ptrn.subentrylen *
                   (uint)(bios->mem).train_ptrn.subentries + (uint)(bios->mem).train_ptrn.rlen) +
                  (uint)(bios->mem).train_ptrn.hlen + (uint)(bios->mem).train_ptrn.offset;
          pbVar1 = (byte *)((long)&peVar9->offset + lVar11);
          *(short *)(pbVar1 + -2) = (short)uVar8;
          bios_u8(bios,uVar8 & 0xffff,(uint8_t *)((long)&peVar9->offset + lVar11));
          *pbVar1 = *pbVar1 & 0x3f;
          bios_u8(bios,*(ushort *)(pbVar1 + -2) + 1,pbVar1 + 1);
          if ((bios->mem).train_ptrn.rlen < 4) {
            (&peVar9->bits)[lVar11] = '\0';
            (&peVar9->modulo)[lVar11] = (uint8_t)uVar12;
          }
          else {
            res_00 = &peVar9->bits + lVar11;
            bios_u8(bios,*(ushort *)((long)peVar9 + lVar11 + -2) + 2,res_00);
            *res_00 = (*res_00 & 7) == 2;
            bios_u8(bios,*(ushort *)((long)peVar9 + lVar11 + -2) + 3,&peVar9->modulo + lVar11);
          }
          bVar10 = *res;
          lVar11 = lVar11 + 6;
        }
        (bios->mem).train_ptrn.valid = '\x01';
        iVar3 = 0;
      }
    }
    else {
      iVar3 = -0xe;
    }
    return iVar3;
  }
  return 0;
}

Assistant:

int
envy_bios_parse_mem_train_ptrn(struct envy_bios *bios) {
	struct envy_bios_mem_train_ptrn *mtp = &bios->mem.train_ptrn;
	if (!mtp->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mtp->offset, &mtp->version);
	err |= bios_u8(bios, mtp->offset+1, &mtp->hlen);
	err |= bios_u8(bios, mtp->offset+2, &mtp->rlen);
	err |= bios_u8(bios, mtp->offset+3, &mtp->subentrylen);
	err |= bios_u8(bios, mtp->offset+4, &mtp->entriesnum);
	mtp->subentries = 1;
	if (err)
		return -EFAULT;

	envy_bios_block(bios, mtp->offset,
			mtp->hlen + mtp->rlen * mtp->entriesnum,
			"MEM TRAIN PATTERN", -1);

	mtp->entries = calloc(mtp->entriesnum, sizeof *mtp->entries);
	if (!mtp->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mtp->entriesnum; i++) {
		struct envy_bios_mem_train_ptrn_entry *entry = &mtp->entries[i];
		entry->offset = mtp->offset + mtp->hlen +
				((mtp->rlen + mtp->subentries * mtp->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->bits);
		entry->bits &= 0x3f;
		err |= bios_u8(bios, entry->offset+1, &entry->modulo);
		if (mtp->rlen >= 4) {
			err |= bios_u8(bios, entry->offset+2, &entry->indirect);
			entry->indirect = (entry->indirect & 0x7) == 0x2;
			err |= bios_u8(bios, entry->offset+3, &entry->indirect_entry);
		} else {
			entry->indirect = 0;
			entry->indirect_entry = i;
		}
	}
	mtp->valid = 1;
	return 0;
}